

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glApi.hpp
# Opt level: O0

void __thiscall
Program::setUniform<glm::mat<4,4,float,(glm::qualifier)0>>
          (Program *this,string *name,mat<4,_4,_float,_(glm::qualifier)0> *val)

{
  bool bVar1;
  ostream *poVar2;
  int local_24;
  mat<4,_4,_float,_(glm::qualifier)0> *pmStack_20;
  int location;
  mat<4,_4,_float,_(glm::qualifier)0> *val_local;
  string *name_local;
  Program *this_local;
  
  pmStack_20 = val;
  val_local = (mat<4,_4,_float,_(glm::qualifier)0> *)name;
  name_local = (string *)this;
  bVar1 = getUniformLocation(this,name,&local_24);
  if ((bVar1) && (bVar1 = bound(this), bVar1)) {
    uniformDispatcher<glm::mat<4,4,float,(glm::qualifier)0>>(local_24,pmStack_20);
  }
  else {
    bVar1 = bound(this);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"=====");
      poVar2 = std::operator<<(poVar2,(string *)val_local);
      std::operator<<(poVar2," uniform was queried but does not exist\n");
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"===== Program is not attached (for uniform \'"
                              );
      poVar2 = std::operator<<(poVar2,(string *)val_local);
      std::operator<<(poVar2,"\')\n");
    }
  }
  return;
}

Assistant:

void Program::setUniform(const std::string & name, const T & val) const
{
  int location;
  if (getUniformLocation(name, location) and bound()) {
    uniformDispatcher<T>(location, val);
  } else if (not bound()) {
    std::cerr << "===== Program is not attached (for uniform '" << name << "')\n";
  } else {
    std::cerr << "=====" << name << " uniform was queried but does not exist\n";
  }
}